

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

SymOpnd * Lowerer::LoadCallInfo(Instr *instrInsert)

{
  Func *this;
  bool bVar1;
  JITTimeFunctionBody *this_00;
  Instr *pIVar2;
  RegOpnd *pRVar3;
  IndirOpnd *src;
  StackSym *sym;
  SymOpnd *pSVar4;
  
  this = instrInsert->m_func;
  this_00 = Func::GetJITFunctionBody(this);
  bVar1 = JITTimeFunctionBody::IsCoroutine(this_00);
  if (bVar1) {
    pIVar2 = LoadGeneratorObject(instrInsert);
    pRVar3 = IR::Opnd::AsRegOpnd(pIVar2->m_dst);
    src = IR::IndirOpnd::New(pRVar3,0x30,TyUint64,this,false);
    pRVar3 = IR::RegOpnd::New(TyUint64,this);
    pIVar2 = InsertMove(&pRVar3->super_Opnd,&src->super_Opnd,instrInsert,true);
    sym = StackSym::New(TyInt64,this);
    pSVar4 = IR::SymOpnd::New(&sym->super_Sym,TyInt64,this);
    InsertMove(&pSVar4->super_Opnd,pIVar2->m_dst,instrInsert,true);
  }
  else {
    sym = LowererMD::GetImplicitParamSlotSym(1,this);
  }
  pSVar4 = IR::SymOpnd::New(&sym->super_Sym,TyInt64,this);
  return pSVar4;
}

Assistant:

IR::SymOpnd *
Lowerer::LoadCallInfo(IR::Instr * instrInsert)
{
    IR::SymOpnd * srcOpnd;
    Func * func = instrInsert->m_func;

    if (func->GetJITFunctionBody()->IsCoroutine())
    {
        // Generator function arguments and ArgumentsInfo are not on the stack.  Instead they
        // are accessed off the generator object (which is prm1).
        IR::Instr *genLoadInstr = LoadGeneratorObject(instrInsert);
        IR::RegOpnd * generatorRegOpnd = genLoadInstr->GetDst()->AsRegOpnd();

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(generatorRegOpnd, Js::JavascriptGenerator::GetCallInfoOffset(), TyMachPtr, func);
        IR::Instr * instr = Lowerer::InsertMove(IR::RegOpnd::New(TyMachPtr, func), indirOpnd, instrInsert);

        StackSym * callInfoSym = StackSym::New(TyMachReg, func);
        IR::SymOpnd * callInfoSymOpnd = IR::SymOpnd::New(callInfoSym, TyMachReg, func);
        Lowerer::InsertMove(callInfoSymOpnd, instr->GetDst(), instrInsert);

        srcOpnd = IR::SymOpnd::New(callInfoSym, TyMachReg, func);
    }
    else
    {
        // Otherwise callInfo is always the "second" argument.
        // The stack looks like this:
        //
        //       script param N
        //       ...
        //       script param 1
        //       callinfo
        //       function object
        //       return addr
        // FP -> FP chain

        StackSym * srcSym = LowererMD::GetImplicitParamSlotSym(1, func);
        srcOpnd = IR::SymOpnd::New(srcSym, TyMachReg, func);
    }

    return srcOpnd;
}